

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDocumentationSection.cxx
# Opt level: O1

void __thiscall cmDocumentationSection::Prepend(cmDocumentationSection *this,char *(*data) [2])

{
  char *b;
  vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_> tmp;
  vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_> local_88;
  cmDocumentationEntry local_70;
  
  local_88.super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  b = (*data)[1];
  if (b != (char *)0x0) {
    do {
      cmDocumentationEntry::cmDocumentationEntry(&local_70,(*data)[0],b);
      std::vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>::
      emplace_back<cmDocumentationEntry>(&local_88,&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70.Brief._M_dataplus._M_p != &local_70.Brief.field_2) {
        operator_delete(local_70.Brief._M_dataplus._M_p,
                        local_70.Brief.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70.Name._M_dataplus._M_p != &local_70.Name.field_2) {
        operator_delete(local_70.Name._M_dataplus._M_p,
                        local_70.Name.field_2._M_allocated_capacity + 1);
      }
      b = data[1][1];
      data = data + 1;
    } while (b != (char *)0x0);
  }
  std::vector<cmDocumentationEntry,std::allocator<cmDocumentationEntry>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<cmDocumentationEntry*,std::vector<cmDocumentationEntry,std::allocator<cmDocumentationEntry>>>>
            ((vector<cmDocumentationEntry,std::allocator<cmDocumentationEntry>> *)&this->Entries,
             (this->Entries).
             super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>._M_impl
             .super__Vector_impl_data._M_start,
             local_88.
             super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>._M_impl
             .super__Vector_impl_data._M_start,
             local_88.
             super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>._M_impl
             .super__Vector_impl_data._M_finish);
  std::vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>::~vector(&local_88);
  return;
}

Assistant:

void cmDocumentationSection::Prepend(const char *data[][2])
{
  std::vector<cmDocumentationEntry> tmp;
  int i = 0;
  while(data[i][1])
    {
    tmp.push_back(cmDocumentationEntry(data[i][0],
                                       data[i][1]));
    data += 1;
    }
  this->Entries.insert(this->Entries.begin(),tmp.begin(),tmp.end());
}